

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O2

int fminunc(custom_function *funcpt,custom_gradient *funcgrad,int N,double *xi,double maxstep,
           int method,double *xf)

{
  double *dx;
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  double __x;
  double dVar5;
  double stol;
  int local_34 [2];
  int niter;
  
  dx = (double *)malloc((long)N * 8);
  local_34[0] = 0;
  uVar4 = 0;
  __x = macheps();
  uVar1 = 0;
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
  }
  for (; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    dx[uVar4] = 1.0;
  }
  if (7 < (uint)method) {
    puts("Method Value should be one of 0,1,2,3,4,5,6 or 7. See Documentation. ");
    exit(1);
  }
  iVar3 = N * 200;
  switch(method) {
  case 0:
    iVar3 = nel_min(funcpt,xi,N,dx,1.0,iVar3,local_34,__x,xf);
    break;
  case 1:
    dVar5 = pow(__x,0.3333333333333333);
    iVar2 = 1000;
    if (1000 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = newton_min_func(funcpt,funcgrad,xi,N,dx,1.0,maxstep,iVar2,local_34,__x,dVar5,
                            dVar5 * dVar5,xf);
    break;
  case 2:
    dVar5 = pow(__x,0.3333333333333333);
    stol = dVar5 * dVar5;
    iVar2 = 1000;
    if (1000 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = 0;
    goto LAB_0012618d;
  case 3:
    dVar5 = pow(__x,0.3333333333333333);
    stol = dVar5 * dVar5;
    iVar2 = 1000;
    if (1000 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = 1;
LAB_0012618d:
    iVar3 = newton_min_trust(funcpt,funcgrad,xi,N,dx,1.0,-1.0,iVar3,iVar2,local_34,__x,dVar5,stol,xf
                            );
    break;
  case 4:
    dVar5 = pow(__x,0.3333333333333333);
    iVar2 = 1000;
    if (1000 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = conjgrad_min_lin(funcpt,funcgrad,xi,N,dx,maxstep,iVar2,local_34,__x,dVar5,dVar5 * dVar5,
                             __x,xf);
    break;
  case 5:
    dVar5 = pow(__x,0.3333333333333333);
    iVar2 = 1000;
    if (1000 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = bfgs_min(funcpt,funcgrad,xi,N,dx,1.0,maxstep,iVar2,local_34,__x,dVar5,dVar5 * dVar5,xf);
    break;
  case 6:
    dVar5 = pow(__x,0.3333333333333333);
    iVar2 = 1000;
    if (1000 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = N;
    if (10 < N) {
      if ((uint)N < 0x15) {
        iVar3 = 10;
      }
      else {
        iVar3 = (uint)(200 < (uint)N) * 5 + 0xf;
      }
    }
    iVar3 = bfgs_l_min(funcpt,funcgrad,xi,N,iVar3,dx,1.0,maxstep,iVar2,local_34,__x,dVar5,
                       dVar5 * dVar5,__x,xf);
    break;
  case 7:
    dVar5 = pow(__x,0.3333333333333333);
    iVar2 = 1000;
    if (1000 < iVar3) {
      iVar2 = iVar3;
    }
    iVar3 = N;
    if (10 < N) {
      if ((uint)N < 0x15) {
        iVar3 = 10;
      }
      else {
        iVar3 = (uint)(200 < (uint)N) * 5 + 0xf;
      }
    }
    iVar3 = bfgs_min2(funcpt,funcgrad,xi,N,iVar3,dx,1.0,maxstep,iVar2,local_34,__x,dVar5,
                      dVar5 * dVar5,__x,xf);
  }
  free(dx);
  return iVar3;
}

Assistant:

int fminunc(custom_function *funcpt, custom_gradient *funcgrad, int N, double *xi,double maxstep, int method,double *xf) {
	int i,retval,MAXITER,niter,m;
	double fsval,eps,gtol,stol,ftol,xtol,delta;
	double *dx;

	dx = (double*) malloc(sizeof(double) * N);
		/*
		 * Method 0 - Nelder-Mead
		 * Method 1 - Newton Line Search
		 * Method 2 - Newton Trust Region - Hook Step
		 * Method 3 - Newton Trust Region - Double Dog-Leg
		 * Method 4 - Conjugate Gradient
		 * Method 5 - BFGS
		 * Method 6 - Limited Memory BFGS
		 * Method 7 - BFGS More-Thuente Line Search
		 */
	/*
	 * Return Codes
	 *
	 * Code 1 denotes probable success.
	 * Codes 2,3 and 6 denote possible success.
	 * Codes 0, 4 and 15 denote failure. [Code 4 my also occur in cases where the minima is realized but
	 * convergence is not achieved due to tolerance values being too small. It is recommended that you use
	 * another method if you suspect that such a scenario has occured.]
	 *
	 * 0 - Input Error
	 * 1 - df(x)/dx <= gtol achieved so current point may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so the point may be the local minima.
	 * 3 - Global Step failed to locate a lower point than the current point so it may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence probably not achieved.
	 * 6 - Function value drops below ftol (relative functional tolerance).
	 * 15 - Overflow occurs. Try a different method.
	 *
	 */
	fsval = 1.0;
	MAXITER = 200*N;
	niter = 0;
	delta = -1.0; // Trust Region default
	eps = macheps(); // Use macheps program

	for(i = 0; i < N;++i) {
		dx[i] = 1.0;
	}

	if (method == 0) {
		retval = nel_min(funcpt,xi,N,dx,fsval,MAXITER,&niter,eps,xf);
	} else if (method == 1) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_func(funcpt,funcgrad,xi,N,dx,fsval,maxstep,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 2) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,0,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 3) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = newton_min_trust(funcpt,funcgrad,xi,N,dx,fsval,delta,1,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 4) {
		gtol = pow(eps,1.0/3.0);
		ftol = gtol * gtol;
		xtol = eps;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = conjgrad_min_lin(funcpt,funcgrad,xi,N,dx,maxstep,MAXITER,&niter,eps,gtol,ftol,xtol,xf);
	} else if (method == 5) {
		gtol = pow(eps,1.0/3.0);
		stol = gtol * gtol;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		retval = bfgs_min(funcpt,funcgrad,xi,N,dx,fsval,maxstep,MAXITER,&niter,eps,gtol,stol,xf);
	} else if (method == 6) {
		gtol = pow(eps,1.0/3.0);
		ftol = gtol * gtol;
		xtol = eps;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		m = mvalue(N);
		retval = bfgs_l_min(funcpt,funcgrad,xi,N,m,dx,fsval,maxstep,MAXITER,&niter,eps,gtol,ftol,xtol,xf);
	}
	else if (method == 7) {
		gtol = pow(eps, 1.0 / 3.0);
		ftol = gtol * gtol;
		xtol = eps;
		if (MAXITER < 1000) {
			MAXITER = 1000;
		}
		m = mvalue(N);
		retval = bfgs_min2(funcpt, funcgrad, xi, N, m, dx, fsval, maxstep, MAXITER, &niter, eps, gtol, ftol, xtol, xf);
	}
	else {
		printf("Method Value should be one of 0,1,2,3,4,5,6 or 7. See Documentation. \n");
		exit(1);
	}



	free(dx);
	return retval;
}